

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::
     VectorArgMinMaxBase<duckdb::GreaterThan,false,(duckdb::OrderType)3,duckdb::SpecializedGenericArgMinMaxState>
     ::Update<duckdb::ArgMinMaxState<duckdb::string_t,long>>
               (Vector *inputs,AggregateInputData *param_2,idx_t input_count,Vector *state_vector,
               idx_t count)

{
  char *pcVar1;
  sel_t *psVar2;
  ulong uVar3;
  long lVar4;
  idx_t count_00;
  idx_t iVar5;
  char *pcVar6;
  idx_t iVar7;
  idx_t i;
  idx_t iVar8;
  data_ptr_t pdVar9;
  ulong uVar10;
  bool bVar11;
  string_t new_value;
  SelectionVector sel;
  LogicalType local_21f8;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  Vector sort_key;
  Vector sliced_input;
  sel_t assign_sel [2048];
  
  UnifiedVectorFormat::UnifiedVectorFormat(&adata);
  Vector::ToUnifiedFormat(inputs,count,&adata);
  UnifiedVectorFormat::UnifiedVectorFormat(&bdata);
  Vector::ToUnifiedFormat(inputs + 1,count,&bdata);
  UnifiedVectorFormat::UnifiedVectorFormat(&sdata);
  Vector::ToUnifiedFormat(state_vector,count,&sdata);
  count_00 = 0;
  pcVar6 = (char *)0x0;
  for (iVar8 = 0; count != iVar8; iVar8 = iVar8 + 1) {
    iVar7 = iVar8;
    if ((bdata.sel)->sel_vector != (sel_t *)0x0) {
      iVar7 = (idx_t)(bdata.sel)->sel_vector[iVar8];
    }
    if ((bdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((bdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar7 >> 6] >>
         (iVar7 & 0x3f) & 1) != 0)) {
      iVar5 = iVar8;
      if ((adata.sel)->sel_vector != (sel_t *)0x0) {
        iVar5 = (idx_t)(adata.sel)->sel_vector[iVar8];
      }
      if (adata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        bVar11 = true;
      }
      else {
        bVar11 = (adata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [iVar5 >> 6] >> (iVar5 & 0x3f) & 1) != 0;
      }
      iVar5 = iVar8;
      if ((sdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar5 = (idx_t)(sdata.sel)->sel_vector[iVar8];
      }
      pcVar1 = *(char **)(sdata.data + iVar5 * 8);
      if ((*pcVar1 != '\x01') || (*(long *)(pcVar1 + 0x18) < *(long *)(bdata.data + iVar7 * 8))) {
        *(long *)(pcVar1 + 0x18) = *(long *)(bdata.data + iVar7 * 8);
        pcVar1[1] = bVar11 ^ 1;
        if (bVar11) {
          lVar4 = count_00 - (pcVar1 == pcVar6);
          assign_sel[lVar4] = (sel_t)iVar8;
          count_00 = lVar4 + 1;
          pcVar6 = pcVar1;
        }
        *pcVar1 = '\x01';
      }
    }
  }
  if (count_00 != 0) {
    LogicalType::LogicalType(&local_21f8,BLOB);
    Vector::Vector(&sort_key,&local_21f8,0x800);
    LogicalType::~LogicalType(&local_21f8);
    SelectionVector::SelectionVector(&sel,assign_sel);
    Vector::Vector(&sliced_input,inputs,&sel,count_00);
    CreateSortKeyHelpers::CreateSortKey(&sliced_input,count_00,(OrderModifiers)0x303,&sort_key);
    pdVar9 = sort_key.data + 8;
    for (uVar10 = 0; count_00 != uVar10; uVar10 = uVar10 + 1) {
      uVar3 = uVar10;
      if (sel.sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)sel.sel_vector[uVar10];
      }
      psVar2 = (sdata.sel)->sel_vector;
      if (psVar2 != (sel_t *)0x0) {
        uVar3 = (ulong)psVar2[uVar3];
      }
      new_value.value.pointer.ptr = (char *)psVar2;
      new_value.value._0_8_ = *(undefined8 *)pdVar9;
      ArgMinMaxStateBase::AssignValue<duckdb::string_t>
                ((ArgMinMaxStateBase *)(*(long *)(sdata.data + uVar3 * 8) + 8),
                 *(string_t **)(pdVar9 + -8),new_value);
      pdVar9 = pdVar9 + 0x10;
    }
    Vector::~Vector(&sliced_input);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sel.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Vector::~Vector(&sort_key);
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&sdata);
  UnifiedVectorFormat::~UnifiedVectorFormat(&bdata);
  UnifiedVectorFormat::~UnifiedVectorFormat(&adata);
  return;
}

Assistant:

static void Update(Vector inputs[], AggregateInputData &, idx_t input_count, Vector &state_vector, idx_t count) {
		auto &arg = inputs[0];
		UnifiedVectorFormat adata;
		arg.ToUnifiedFormat(count, adata);

		using ARG_TYPE = typename STATE::ARG_TYPE;
		using BY_TYPE = typename STATE::BY_TYPE;
		auto &by = inputs[1];
		UnifiedVectorFormat bdata;
		auto extra_state = UPDATE_TYPE::CreateExtraState(count);
		UPDATE_TYPE::PrepareData(by, count, extra_state, bdata);
		const auto bys = UnifiedVectorFormat::GetData<BY_TYPE>(bdata);

		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);

		STATE *last_state = nullptr;
		sel_t assign_sel[STANDARD_VECTOR_SIZE];
		idx_t assign_count = 0;

		auto states = UnifiedVectorFormat::GetData<STATE *>(sdata);
		for (idx_t i = 0; i < count; i++) {
			const auto bidx = bdata.sel->get_index(i);
			if (!bdata.validity.RowIsValid(bidx)) {
				continue;
			}
			const auto bval = bys[bidx];

			const auto aidx = adata.sel->get_index(i);
			const auto arg_null = !adata.validity.RowIsValid(aidx);
			if (IGNORE_NULL && arg_null) {
				continue;
			}

			const auto sidx = sdata.sel->get_index(i);
			auto &state = *states[sidx];
			if (!state.is_initialized || COMPARATOR::template Operation<BY_TYPE>(bval, state.value)) {
				STATE::template AssignValue<BY_TYPE>(state.value, bval);
				state.arg_null = arg_null;
				// micro-adaptivity: it is common we overwrite the same state repeatedly
				// e.g. when running arg_max(val, ts) and ts is sorted in ascending order
				// this check essentially says:
				// "if we are overriding the same state as the last row, the last write was pointless"
				// hence we skip the last write altogether
				if (!arg_null) {
					if (&state == last_state) {
						assign_count--;
					}
					assign_sel[assign_count++] = UnsafeNumericCast<sel_t>(i);
					last_state = &state;
				}
				state.is_initialized = true;
			}
		}
		if (assign_count == 0) {
			// no need to assign anything: nothing left to do
			return;
		}
		Vector sort_key(LogicalType::BLOB);
		auto modifiers = OrderModifiers(ORDER_TYPE, OrderByNullType::NULLS_LAST);
		// slice with a selection vector and generate sort keys
		SelectionVector sel(assign_sel);
		Vector sliced_input(arg, sel, assign_count);
		CreateSortKeyHelpers::CreateSortKey(sliced_input, assign_count, modifiers, sort_key);
		auto sort_key_data = FlatVector::GetData<string_t>(sort_key);

		// now assign sort keys
		for (idx_t i = 0; i < assign_count; i++) {
			const auto sidx = sdata.sel->get_index(sel.get_index(i));
			auto &state = *states[sidx];
			STATE::template AssignValue<ARG_TYPE>(state.arg, sort_key_data[i]);
		}
	}